

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Status XML_SetBase(XML_Parser parser,XML_Char *p)

{
  XML_Char *pXVar1;
  XML_Char *p_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local._4_4_ = XML_STATUS_ERROR;
  }
  else {
    if (p == (XML_Char *)0x0) {
      parser->m_curBase = (XML_Char *)0x0;
    }
    else {
      pXVar1 = poolCopyString(&parser->m_dtd->pool,p);
      if (pXVar1 == (XML_Char *)0x0) {
        return XML_STATUS_ERROR;
      }
      parser->m_curBase = pXVar1;
    }
    parser_local._4_4_ = XML_STATUS_OK;
  }
  return parser_local._4_4_;
}

Assistant:

enum XML_Status XMLCALL
XML_SetBase(XML_Parser parser, const XML_Char *p)
{
  if (parser == NULL)
    return XML_STATUS_ERROR;
  if (p) {
    p = poolCopyString(&parser->m_dtd->pool, p);
    if (!p)
      return XML_STATUS_ERROR;
    parser->m_curBase = p;
  }
  else
    parser->m_curBase = NULL;
  return XML_STATUS_OK;
}